

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::Write3dmGoo(ON_BinaryArchive *this,ON_3dmGoo *goo)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  size_t sVar4;
  size_t count;
  ON__INT32 local_24;
  
  uVar2 = goo->m_typecode;
  if (uVar2 != 0) {
    bVar1 = this->m_bDoChunkCRC;
    this->m_bDoChunkCRC = false;
    if ((int)uVar2 < 0) {
      if ((goo->m_value == 0) || ((bVar3 = false, 0 < goo->m_value && (goo->m_goo != (uchar *)0x0)))
         ) {
        bVar3 = WriteInt32(this,1,&local_24);
        if (bVar3) {
          bVar3 = WriteInt32(this,1,&local_24);
        }
        if ((bVar3 != false) && (count = (size_t)goo->m_value, 0 < (long)count)) {
          sVar4 = Write(this,count,goo->m_goo);
          bVar3 = sVar4 == count;
        }
      }
    }
    else {
      bVar3 = WriteInt32(this,1,&local_24);
      if (bVar3) {
        bVar3 = WriteInt32(this,1,&local_24);
      }
    }
    this->m_bDoChunkCRC = bVar1;
    return bVar3;
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::Write3dmGoo( const ON_3dmGoo& goo )
{
  bool rc = false;

  if ( goo.m_typecode ) {
    const bool savedDoCRC = m_bDoChunkCRC;
    m_bDoChunkCRC = false;
    if ( 0 != (goo.m_typecode & TCODE_SHORT) ) {
      if ( goo.m_value == 0 || (goo.m_value > 0 && goo.m_goo) ) {
        // write long chunk - do not use Begin/EndWrite3dmChunk() because
        //                    goo may contain subchunks and CRC would be
        //                    incorrectly computed.
        rc = WriteInt( goo.m_typecode );
        if (rc) rc = WriteInt( goo.m_value );
        if (rc && goo.m_value>0) rc = WriteByte( goo.m_value, goo.m_goo );
      }
    }
    else {
      // write short chunk
      rc = WriteInt( goo.m_typecode );
      if (rc) rc = WriteInt( goo.m_value );
    }
    m_bDoChunkCRC = savedDoCRC;
  }
  
  return rc;
}